

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O2

void __thiscall
TEST_TestMemoryAccountant_countMaximumAllocationsAtATime_Test::testBody
          (TEST_TestMemoryAccountant_countMaximumAllocationsAtATime_Test *this)

{
  UtestShell *pUVar1;
  size_t sVar2;
  TestTerminator *pTVar3;
  MemoryAccountant *this_00;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant;
  MemoryAccountant::alloc(this_00,4);
  MemoryAccountant::alloc(this_00,4);
  MemoryAccountant::dealloc(this_00,4);
  MemoryAccountant::dealloc(this_00,4);
  MemoryAccountant::alloc(this_00,4);
  pUVar1 = UtestShell::getCurrent();
  sVar2 = MemoryAccountant::maximumAllocationAtATimeOfSize(this_00,4);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,2,sVar2,"LONGS_EQUAL(2, accountant.maximumAllocationAtATimeOfSize(4)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x1aa,pTVar3);
  return;
}

Assistant:

TEST(TestMemoryAccountant, countMaximumAllocationsAtATime)
{
    accountant.alloc(4);
    accountant.alloc(4);
    accountant.dealloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);
    LONGS_EQUAL(2, accountant.maximumAllocationAtATimeOfSize(4));
}